

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O3

char * uo_json_find_end(char *json)

{
  byte bVar1;
  ushort uVar2;
  ushort *puVar3;
  ushort **ppuVar4;
  char *pcVar5;
  __int32_t **pp_Var6;
  char *pcVar7;
  char cVar8;
  char *pcVar9;
  
  ppuVar4 = __ctype_b_loc();
  puVar3 = *ppuVar4;
  pcVar9 = json + -2;
  do {
    pcVar7 = pcVar9;
    bVar1 = pcVar7[2];
    pcVar9 = pcVar7 + 1;
  } while ((*(byte *)((long)puVar3 + (long)(char)bVar1 * 2 + 1) & 0x20) != 0);
  pcVar5 = pcVar7 + 3;
  if (bVar1 < 0x66) {
    if (bVar1 != 0) {
      if (bVar1 == 0x22) {
        pcVar9 = uo_json_find_str_end(pcVar7 + 2);
        return pcVar9;
      }
      if (bVar1 != 0x5b) goto LAB_00101b79;
      pcVar9 = strchr(pcVar5,0x5d);
      if (pcVar9 != (char *)0x0) {
        if (pcVar5 != pcVar9) {
          do {
            if (*pcVar5 == '\0') {
              return (char *)0x0;
            }
            pcVar5 = pcVar5 + -1;
            do {
              pcVar9 = pcVar5 + 1;
              pcVar5 = pcVar5 + 1;
            } while ((*(byte *)((long)puVar3 + (long)*pcVar9 * 2 + 1) & 0x20) != 0);
            pcVar9 = uo_json_find_end(pcVar5);
            if (pcVar9 == (char *)0x0) {
              return (char *)0x0;
            }
            pcVar7 = strchr(pcVar9 + 1,0x5d);
            if (pcVar7 == (char *)0x0) {
              return (char *)0x0;
            }
            pcVar5 = strchr(pcVar9,0x2c);
          } while (pcVar5 != (char *)0x0);
          return pcVar7 + 1;
        }
        goto LAB_00101b6b;
      }
    }
LAB_00101c0e:
    pcVar7 = (char *)0x0;
  }
  else {
    if (bVar1 < 0x74) {
      if (bVar1 == 0x66) {
        return pcVar7 + 7;
      }
      if (bVar1 == 0x6e) {
LAB_00101b73:
        return pcVar7 + 6;
      }
    }
    else {
      if (bVar1 == 0x74) goto LAB_00101b73;
      if (bVar1 == 0x7b) {
        do {
          if ((*pcVar5 == '\0') || (pcVar9 = strchr(pcVar5,0x7d), pcVar9 == (char *)0x0))
          goto LAB_00101c0e;
          pcVar7 = strchr(pcVar5,0x22);
          if ((pcVar7 == (char *)0x0) || (pcVar9 < pcVar7)) break;
          pcVar9 = uo_json_find_str_end(pcVar7);
          if ((pcVar9 == (char *)0x0) || (pcVar9 = strchr(pcVar9,0x3a), pcVar9 == (char *)0x0))
          goto LAB_00101c0e;
          do {
            pcVar7 = pcVar9 + 1;
            pcVar9 = pcVar9 + 1;
          } while ((*(byte *)((long)puVar3 + (long)*pcVar7 * 2 + 1) & 0x20) != 0);
          pcVar7 = uo_json_find_end(pcVar9);
          if ((pcVar7 == (char *)0x0) || (pcVar9 = strchr(pcVar7 + 1,0x7d), pcVar9 == (char *)0x0))
          goto LAB_00101c0e;
          pcVar5 = strchr(pcVar7,0x2c);
        } while (pcVar5 != (char *)0x0);
LAB_00101b6b:
        return pcVar9 + 1;
      }
    }
LAB_00101b79:
    pcVar7 = pcVar9 + (bVar1 == 0x2d);
    pcVar9 = pcVar9 + (ulong)(bVar1 == 0x2d) + 1;
    do {
      cVar8 = *pcVar9;
      pcVar9 = pcVar9 + 1;
      pcVar7 = pcVar7 + 1;
    } while ((*(byte *)((long)puVar3 + (long)cVar8 * 2 + 1) & 8) != 0);
    if ((cVar8 != '.') && (pcVar9 = pcVar7, cVar8 == '\0')) {
      return pcVar7;
    }
    do {
      pcVar7 = pcVar9;
      cVar8 = *pcVar7;
      uVar2 = puVar3[cVar8];
      pcVar9 = pcVar7 + 1;
    } while ((uVar2 >> 0xb & 1) != 0);
    pp_Var6 = __ctype_tolower_loc();
    if ((*pp_Var6)[cVar8] == 0x65) {
      if ((*pcVar9 != '-') && (*pcVar9 != '+')) goto LAB_00101c0e;
      do {
        cVar8 = pcVar9[1];
        pcVar9 = pcVar9 + 1;
        uVar2 = puVar3[cVar8];
        pcVar7 = pcVar9;
      } while ((uVar2 >> 0xb & 1) != 0);
    }
    if (((cVar8 != '\0') && (cVar8 != ',')) && ((uVar2 >> 0xd & 1) == 0)) {
      pcVar7 = (char *)0x0;
    }
  }
  return pcVar7;
}

Assistant:

char *uo_json_find_end(
    const char *json)
{
    while (isspace(*json))
        ++json;

    switch (*json)
    {
        case '\0': return NULL;
        case '{':  return uo_json_find_obj_end(json);
        case '[':  return uo_json_find_arr_end(json);
        case '"':  return uo_json_find_str_end(json);
        case 'n':  return (char *)json + UO_STRLEN("null");
        case 't':  return (char *)json + UO_STRLEN("true");
        case 'f':  return (char *)json + UO_STRLEN("false");
        default:   return uo_json_find_num_end(json);
    }
}